

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAAGettnSolutionYp(IDAMem IDA_mem,N_Vector yp)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  sunrealtype gam;
  sunrealtype D;
  sunrealtype C;
  int retval;
  int kord;
  int j;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0x5b8) == 0) {
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x160),in_RSI);
    local_4 = 0;
  }
  else {
    local_20 = *(int *)(in_RDI + 0x4bc);
    if (*(int *)(in_RDI + 0x4bc) == 0) {
      local_20 = 1;
    }
    local_30 = 1.0;
    local_38 = 0.0;
    local_40 = 0.0;
    for (local_1c = 1; local_1c <= local_20; local_1c = local_1c + 1) {
      local_38 = local_38 * local_40 +
                 local_30 / *(double *)(in_RDI + 0x188 + (long)(local_1c + -1) * 8);
      local_30 = local_30 * local_40;
      local_40 = *(double *)(in_RDI + 0x188 + (long)(local_1c + -1) * 8) /
                 *(double *)(in_RDI + 0x188 + (long)local_1c * 8);
      *(double *)(in_RDI + 0x800 + (long)(local_1c + -1) * 8) = local_38;
    }
    iVar1 = N_VLinearCombination(local_20,in_RDI + 0x800,in_RDI + 0x160,in_RSI);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

static int IDAAGettnSolutionYp(IDAMem IDA_mem, N_Vector yp)
{
  int j, kord, retval;
  sunrealtype C, D, gam;

  if (IDA_mem->ida_nst == 0)
  {
    /* If no integration was done, return the yp supplied by user.*/
    N_VScale(ONE, IDA_mem->ida_phi[1], yp);

    return (0);
  }

  /* Compute yp as in IDAGetSolution for this particular case when t=tn. */

  kord = IDA_mem->ida_kused;
  if (IDA_mem->ida_kused == 0) { kord = 1; }

  C   = ONE;
  D   = ZERO;
  gam = ZERO;
  for (j = 1; j <= kord; j++)
  {
    D   = D * gam + C / IDA_mem->ida_psi[j - 1];
    C   = C * gam;
    gam = IDA_mem->ida_psi[j - 1] / IDA_mem->ida_psi[j];

    IDA_mem->ida_dvals[j - 1] = D;
  }

  retval = N_VLinearCombination(kord, IDA_mem->ida_dvals, IDA_mem->ida_phi + 1,
                                yp);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (0);
}